

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall
kj::UnixEventPort::updateNextTimerEvent
          (UnixEventPort *this,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *time)

{
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *this_00;
  byte bVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
  aVar2;
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fd;
  int iVar3;
  bool bVar4;
  Fault f_1;
  Fault f;
  itimerspec ts;
  Fault local_60;
  epoll_event local_58;
  itimerspec local_48;
  
  bVar1 = (time->ptr).isSet;
  if (((bool)bVar1 != false) || (this->timerfdIsArmed == true)) {
    this_00 = &(this->timerFd).ptr.field_1;
    if ((this->timerFd).ptr.isSet == true) {
      __fd.value.fd = *(OwnFd *)this_00;
    }
    else {
      do {
        __fd = (anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2)timerfd_create(1,0x80800);
        if (-1 < (int)__fd) goto LAB_0049b180;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        local_58.events = 0;
        local_58._4_4_ = 0;
        local_48.it_interval.tv_sec = 0;
        local_48.it_interval.tv_nsec = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_58,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_58);
      }
LAB_0049b180:
      if ((this->timerFd).ptr.isSet == true) {
        (this->timerFd).ptr.isSet = false;
        local_60.exception._0_4_ = __fd;
        OwnFd::~OwnFd(&this_00->value);
        __fd = local_60.exception._0_4_;
      }
      (this->timerFd).ptr.field_1 = __fd;
      local_60.exception._0_4_ = (anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2)0xffffffff;
      (this->timerFd).ptr.isSet = true;
      OwnFd::~OwnFd((OwnFd *)&local_60);
      local_58.events = 1;
      local_58._4_4_ = 1;
      local_58.data.fd = 0;
      do {
        iVar3 = epoll_ctl((this->epollFd).fd,1,(int)__fd,&local_58);
        if (-1 < iVar3) goto LAB_0049b1fe;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        local_60.exception = (Exception *)0x0;
        local_48.it_interval.tv_sec = 0;
        local_48.it_interval.tv_nsec = 0;
        kj::_::Debug::Fault::init
                  (&local_60,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_60);
      }
LAB_0049b1fe:
      bVar1 = (time->ptr).isSet;
    }
    local_48.it_value.tv_sec = 0;
    local_48.it_value.tv_nsec = 0;
    local_48.it_interval.tv_sec = 0;
    local_48.it_interval.tv_nsec = 0;
    bVar4 = (bVar1 & 1) != 0;
    if (bVar4) {
      aVar2 = (time->ptr).field_1;
      local_48.it_value.tv_sec = (long)aVar2 / 1000000000;
      local_48.it_value.tv_nsec = (long)aVar2 % 1000000000;
    }
    this->timerfdIsArmed = bVar4;
    do {
      iVar3 = timerfd_settime((int)__fd,1,&local_48,(itimerspec *)0x0);
      if (-1 < iVar3) {
        return;
      }
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      local_60.exception = (Exception *)0x0;
      local_58.events = 0;
      local_58._4_4_ = 0;
      local_58.data.fd = 0;
      local_58.data.u64._4_4_ = 0;
      kj::_::Debug::Fault::init
                (&local_60,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_60);
    }
  }
  return;
}

Assistant:

void UnixEventPort::updateNextTimerEvent(kj::Maybe<TimePoint> time) {
  if (time == kj::none && !timerfdIsArmed) {
    // No change needed.
    return;
  }

  // Create the timerfd if needed.
  int tfd;
  KJ_IF_SOME(f, timerFd) {
    tfd = f;
  } else {
    tfd = timerFd.emplace(
        KJ_SYSCALL_FD(timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK)));

    struct epoll_event event;
    memset(&event, 0, sizeof(event));
    event.events = EPOLLIN;
    event.data.u64 = 1;
    KJ_SYSCALL(epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event));
  }